

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

_lookup_path_token * __thiscall
c4::yml::Tree::_next_token
          (_lookup_path_token *__return_storage_ptr__,Tree *this,lookup_result *r,
          _lookup_path_token *parent)

{
  size_t more;
  char cVar1;
  NodeType_e NVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  size_t sVar8;
  _lookup_path_token *p_Var9;
  Tree *pTVar10;
  ro_substr chars;
  csubstr unres;
  char msg [55];
  csubstr local_108;
  NodeData *local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined7 uStack_d0;
  undefined1 uStack_c9;
  undefined7 uStack_c8;
  pfn_allocate local_c0;
  pfn_free p_Stack_b8;
  pfn_error local_b0;
  char *pcStack_a8;
  pfn_error local_a0;
  char *local_98;
  size_t sStack_90;
  char *local_88;
  char *pcStack_80;
  size_t local_78;
  char *local_70;
  size_t sStack_68;
  char *local_60;
  char *pcStack_58;
  size_t local_50;
  NodeData *local_48;
  size_t sStack_40;
  
  local_108 = lookup_result::unresolved(r);
  if (local_108.str != (char *)0x0 && local_108.len != 0) {
    if (*local_108.str != '[') {
      pTVar10 = (Tree *)&local_108;
      chars.len = 2;
      chars.str = ".[";
      sVar8 = basic_substring<const_char>::first_of((basic_substring<const_char> *)pTVar10,chars,0);
      if (sVar8 == 0xffffffffffffffff) {
        _advance(pTVar10,r,local_108.len);
        NVar2 = (parent->type).type;
        (__return_storage_ptr__->value).str = local_108.str;
        (__return_storage_ptr__->value).len = local_108.len;
        if (NVar2 == NOTYPE || (NVar2 & SEQ) != NOTYPE) {
          (__return_storage_ptr__->type).type = VAL;
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->type).type = KEYVAL;
        return __return_storage_ptr__;
      }
      if (local_108.len <= sVar8) {
        if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        handle_error(0x24a7ca,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      cVar1 = *(char *)((long)&((NodeType *)local_108.str)->type + sVar8);
      if ((cVar1 != '.') && (cVar1 != '[')) {
        local_d8 = ' ';
        uStack_d7 = '|';
        uStack_d6 = '|';
        uStack_d5 = ' ';
        uStack_d4 = 'u';
        uStack_d3 = 'n';
        uStack_d2 = 'r';
        uStack_d1 = 'e';
        uStack_d0 = 0x205d736f705b73;
        local_e8 = 0x6e;
        uStack_e7 = 0x736f705b736572;
        uStack_e0 = 0x5d;
        uStack_df = 0x272e27203d3d20;
        local_f8 = (NodeData *)0x6166206b63656863;
        uStack_f0 = 0x69;
        uStack_ef = 0x7528203a64656c;
        uStack_c9 = 0x3d;
        uStack_c8 = 0x29275b27203d;
        if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        local_70 = (char *)0x0;
        sStack_68 = 0x69c9;
        local_60 = (char *)0x0;
        pcStack_58 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_50 = 0x65;
        pTVar10 = (Tree *)&stack0xffffffffffffff08;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x69c9) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x69c9) << 0x40,8);
        LVar4.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar4.name.len = 0x65;
        (*(this->m_callbacks).m_error)((char *)pTVar10,0x37,LVar4,(this->m_callbacks).m_user_data);
      }
      if (local_108.len <= sVar8) {
        if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        handle_error(0x24a7ca,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      cVar1 = *(char *)((long)&((NodeType *)local_108.str)->type + sVar8);
      if (cVar1 != '[') {
        if (cVar1 == '.') {
          if (sVar8 == 0) {
            local_e8 = 0x6f;
            uStack_e7 = 0x2930203d212073;
            uStack_e0 = 0;
            local_f8 = (NodeData *)0x6166206b63656863;
            uStack_f0 = 0x69;
            uStack_ef = 0x7028203a64656c;
            if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar3 = (code *)swi(3);
              p_Var9 = (_lookup_path_token *)(*pcVar3)();
              return p_Var9;
            }
            local_98 = (char *)0x0;
            sStack_90 = 0x69cc;
            local_88 = (char *)0x0;
            pcStack_80 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_78 = 0x65;
            pTVar10 = (Tree *)&stack0xffffffffffffff08;
            LVar5.super_LineCol.col = 0;
            LVar5.super_LineCol.offset = SUB168(ZEXT816(0x69cc) << 0x40,0);
            LVar5.super_LineCol.line = SUB168(ZEXT816(0x69cc) << 0x40,8);
            LVar5.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar5.name.len = 0x65;
            (*(this->m_callbacks).m_error)
                      ((char *)pTVar10,0x19,LVar5,(this->m_callbacks).m_user_data);
          }
          _advance(pTVar10,r,sVar8 + 1);
          if (sVar8 <= local_108.len) {
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)&stack0xffffffffffffff08,local_108.str,sVar8);
            (__return_storage_ptr__->value).str = (char *)local_f8;
            (__return_storage_ptr__->value).len = CONCAT71(uStack_ef,uStack_f0);
            (__return_storage_ptr__->type).type = MAP;
            return __return_storage_ptr__;
          }
          if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            p_Var9 = (_lookup_path_token *)(*pcVar3)();
            return p_Var9;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x154e,"num <= len || num == npos");
        }
        local_e8 = 0x6e;
        uStack_e7 = 0x736f705b736572;
        uStack_e0 = 0x5d;
        uStack_df = 0x275b27203d3d20;
        local_f8 = (NodeData *)0x6166206b63656863;
        uStack_f0 = 0x69;
        uStack_ef = 0x7528203a64656c;
        _local_d8 = CONCAT62(_uStack_d6,0x29);
        if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          p_Var9 = (_lookup_path_token *)(*pcVar3)();
          return p_Var9;
        }
        local_c0 = (pfn_allocate)0x0;
        p_Stack_b8 = (pfn_free)0x69d1;
        local_b0 = (pfn_error)0x0;
        pcStack_a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_a0 = (pfn_error)0x65;
        pTVar10 = (Tree *)&stack0xffffffffffffff08;
        LVar6.super_LineCol.col = 0;
        LVar6.super_LineCol.offset = SUB168(ZEXT816(0x69d1) << 0x40,0);
        LVar6.super_LineCol.line = SUB168(ZEXT816(0x69d1) << 0x40,8);
        LVar6.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar6.name.len = 0x65;
        (*(this->m_callbacks).m_error)((char *)pTVar10,0x22,LVar6,(this->m_callbacks).m_user_data);
      }
      _advance(pTVar10,r,sVar8);
      if (sVar8 <= local_108.len) {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)&stack0xffffffffffffff08,local_108.str,sVar8);
        (__return_storage_ptr__->value).str = (char *)local_f8;
        (__return_storage_ptr__->value).len = CONCAT71(uStack_ef,uStack_f0);
        (__return_storage_ptr__->type).type = SEQ;
        return __return_storage_ptr__;
      }
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        p_Var9 = (_lookup_path_token *)(*pcVar3)();
        return p_Var9;
      }
      handle_error(0x24a7ca,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
    sVar8 = basic_substring<const_char>::first_of(&local_108,']',0);
    if (sVar8 != 0xffffffffffffffff) {
      more = sVar8 + 1;
      if ((more == 0xffffffffffffffff) || (sVar8 < local_108.len)) {
        sVar8 = more;
        if (more == 0xffffffffffffffff) {
          sVar8 = local_108.len;
        }
        pTVar10 = (Tree *)&stack0xffffffffffffff08;
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)pTVar10,local_108.str,sVar8);
        sStack_40 = CONCAT71(uStack_ef,uStack_f0);
        local_48 = local_f8;
        _advance(pTVar10,r,more);
        (__return_storage_ptr__->value).str = (char *)local_48;
        (__return_storage_ptr__->value).len = sStack_40;
        (__return_storage_ptr__->type).type = KEY;
        return __return_storage_ptr__;
      }
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        p_Var9 = (_lookup_path_token *)(*pcVar3)();
        return p_Var9;
      }
      handle_error(0x24a7ca,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
  }
  (__return_storage_ptr__->value).str = (char *)0x0;
  (__return_storage_ptr__->value).len = 0;
  (__return_storage_ptr__->type).type = NOTYPE;
  return __return_storage_ptr__;
}

Assistant:

Tree::_lookup_path_token Tree::_next_token(lookup_result *r, _lookup_path_token const& parent) const
{
    csubstr unres = r->unresolved();
    if(unres.empty())
        return {};

    // is it an indexation like [0], [1], etc?
    if(unres.begins_with('['))
    {
        size_t pos = unres.find(']');
        if(pos == csubstr::npos)
            return {};
        csubstr idx = unres.first(pos + 1);
        _advance(r, pos + 1);
        return {idx, KEY};
    }

    // no. so it must be a name
    size_t pos = unres.first_of(".[");
    if(pos == csubstr::npos)
    {
        _advance(r, unres.len);
        NodeType t;
        if(( ! parent) || parent.type.is_seq())
            return {unres, VAL};
        return {unres, KEYVAL};
    }

    // it's either a map or a seq
    _RYML_CB_ASSERT(m_callbacks, unres[pos] == '.' || unres[pos] == '[');
    if(unres[pos] == '.')
    {
        _RYML_CB_ASSERT(m_callbacks, pos != 0);
        _advance(r, pos + 1);
        return {unres.first(pos), MAP};
    }

    _RYML_CB_ASSERT(m_callbacks, unres[pos] == '[');
    _advance(r, pos);
    return {unres.first(pos), SEQ};
}